

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O2

bool __thiscall EventLoop::updateSocket(EventLoop *this,int fd,uint mode)

{
  uint __errnum;
  FILE *__stream;
  int iVar1;
  iterator iVar2;
  uint *puVar3;
  bool bVar4;
  int fd_local;
  undefined8 local_60 [4];
  uint32_t local_3c;
  int local_38;
  undefined4 local_34;
  
  fd_local = fd;
  std::mutex::lock(&this->mMutex);
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>,_std::_Select1st<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<unsigned_int,_std::function<void_(int,_unsigned_int)>_>_>_>_>
          ::find(&(this->mSockets)._M_t,&fd_local);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->mSockets)._M_t._M_impl.super__Rb_tree_header) {
    bVar4 = false;
    fprintf(_stderr,"Unable to find socket to update %d\n",(ulong)(uint)fd_local);
  }
  else {
    *(uint *)&iVar2._M_node[1]._M_parent = mode;
    local_34 = 0;
    local_3c = (mode & 1 | (mode & 0xfffffff0) << 0x1b) + (mode & 2) * 2 + (mode & 4) * 0x10000000 +
               0x80002000;
    local_38 = fd_local;
    iVar1 = epoll_ctl(this->mPollFd,3,fd_local,(epoll_event *)&local_3c);
    bVar4 = true;
    if (iVar1 == -1) {
      puVar3 = (uint *)__errno_location();
      iVar1 = fd_local;
      __stream = _stderr;
      __errnum = *puVar3;
      if ((__errnum != 2) && (__errnum != 0x11)) {
        Rct::strerror((Rct *)local_60,__errnum);
        bVar4 = false;
        fprintf(__stream,"Unable to register socket %d with mode %x: %d (%s)\n",(ulong)(uint)iVar1,
                (ulong)mode,(ulong)__errnum,local_60[0]);
        std::__cxx11::string::~string((string *)local_60);
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
  return bVar4;
}

Assistant:

bool EventLoop::updateSocket(int fd, unsigned int mode)
{
    std::lock_guard<std::mutex> locker(mMutex);
    auto socket = mSockets.find(fd);
    if (socket == mSockets.end()) {
        fprintf(stderr, "Unable to find socket to update %d\n", fd);
        return false;
    }
#if defined(HAVE_KQUEUE)
    const int oldMode = socket->second.first;
#endif
    socket->second.first = mode;

    int e;
#if defined(HAVE_EPOLL)
    epoll_event ev;
    memset(&ev, 0, sizeof(ev));
    ev.events = EPOLLRDHUP;
    if (!(mode & SocketLevelTriggered))
        ev.events |= EPOLLET;
    if (mode & SocketRead)
        ev.events |= EPOLLIN;
    if (mode & SocketWrite)
        ev.events |= EPOLLOUT;
    if (mode & SocketOneShot)
        ev.events |= EPOLLONESHOT;
    ev.data.fd = fd;
    e = epoll_ctl(mPollFd, EPOLL_CTL_MOD, fd, &ev);
#elif defined(HAVE_KQUEUE)
    e = 0;
    const struct { int rf; int kf; } flags[] = {
        { SocketRead, EVFILT_READ },
        { SocketWrite, EVFILT_WRITE },
        { 0, 0 }
    };
    for (int i = 0; flags[i].rf; ++i) {
        if (!(mode & flags[i].rf) && !(oldMode & flags[i].rf))
            continue;
        struct kevent ev;
        memset(&ev, '\0', sizeof(struct kevent));
        ev.ident = fd;
        if (mode & flags[i].rf) {
            ev.flags = EV_ADD|EV_ENABLE;
            if (mode & SocketOneShot)
                ev.flags |= EV_ONESHOT;
        } else {
            assert(oldMode & flags[i].rf);
            ev.flags = EV_DELETE|EV_DISABLE;
        }
        ev.filter = flags[i].kf;
        eintrwrap(e, kevent(mPollFd, &ev, 1, 0, 0, 0));
    }
#elif defined(HAVE_SELECT)
    e = 0; // fake ok
    wakeup();
#endif
    if (e == -1) {
        if (errno != EEXIST && errno != ENOENT) {
            fprintf(stderr, "Unable to register socket %d with mode %x: %d (%s)\n",
                    fd, mode, errno, Rct::strerror().constData());
            return false;
        }
    }
    return true;
}